

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

FunctionBody * __thiscall
Js::ProbeContainer::GetGlobalFunc
          (ProbeContainer *this,ScriptContext *scriptContext,DWORD_PTR secondaryHostSourceContext)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *this_00;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar8;
  undefined4 *puVar9;
  DWORD_PTR DVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  FunctionBody *local_38;
  
  pLVar8 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(&scriptContext->sourceList);
  iVar14 = (pLVar8->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count;
  if (0 < iVar14) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar13 = 0;
    do {
      pRVar1 = (pLVar8->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar13].ptr;
      if ((((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
           && (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0))
          && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) &&
         (uVar7 = *(uint *)((long)plVar3 + 0x1c), uVar7 != 0)) {
        local_38 = (FunctionBody *)0x0;
        uVar12 = 0;
        do {
          iVar14 = *(int *)(*plVar3 + uVar12 * 4);
          if (iVar14 != -1) {
            do {
              lVar11 = (long)iVar14;
              iVar14 = *(int *)(plVar3[1] + 8 + lVar11 * 0x10);
              this_00 = *(FunctionBody **)(plVar3[1] + lVar11 * 0x10);
              if (this_00 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar9 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,199,"(functionBody)","functionBody");
                if (!bVar6) {
                  pcVar4 = (code *)invalidInstructionException();
                  (*pcVar4)();
                }
                *puVar9 = 0;
                DVar10 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)0x0);
                bVar5 = DAT_00000046;
                if (DVar10 == secondaryHostSourceContext) goto joined_r0x008c8b8b;
              }
              else {
                DVar10 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)this_00);
                if (DVar10 == secondaryHostSourceContext) {
                  bVar5 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
joined_r0x008c8b8b:
                  if ((bVar5 & 0x10) != 0) {
                    local_38 = this_00;
                  }
                }
              }
            } while (iVar14 != -1);
            uVar7 = *(uint *)((long)plVar3 + 0x1c);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar7);
        if (local_38 != (FunctionBody *)0x0) {
          return local_38;
        }
        iVar14 = (pLVar8->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar14);
  }
  return (FunctionBody *)0x0;
}

Assistant:

FunctionBody * ProbeContainer::GetGlobalFunc(ScriptContext* scriptContext, DWORD_PTR secondaryHostSourceContext)
    {
        return scriptContext->FindFunction([&secondaryHostSourceContext] (FunctionBody* pFunc) {
            return ((pFunc->GetSecondaryHostSourceContext() == secondaryHostSourceContext) &&
                     pFunc->GetIsGlobalFunc());
        });
    }